

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseEditInsert(linenoiseState *l,char *cbuf,int clen)

{
  size_t sVar1;
  size_t sVar2;
  ssize_t sVar3;
  int clen_local;
  char *cbuf_local;
  linenoiseState *l_local;
  
  if (l->len + (long)clen <= l->buflen) {
    if (l->len == l->pos) {
      memcpy(l->buf + l->pos,cbuf,(long)clen);
      l->pos = (long)clen + l->pos;
      l->len = (long)clen + l->len;
      l->buf[l->len] = '\0';
      if (mlmode == 0) {
        sVar1 = promptTextColumnLen(l->prompt,l->plen);
        sVar2 = columnPos(l->buf,l->len,l->len);
        if ((sVar1 + sVar2 < l->cols) && (hintsCallback == (linenoiseHintsCallback *)0x0)) {
          if (maskmode != 1) {
            sVar3 = write(l->ofd,cbuf,(long)clen);
            if (sVar3 != -1) {
              return 0;
            }
            return -1;
          }
          sVar3 = write(l->ofd,"*\x1b[H\x1b[2J",1);
          if (sVar3 != -1) {
            return 0;
          }
          return -1;
        }
      }
      refreshLine(l);
    }
    else {
      memmove(l->buf + (long)clen + l->pos,l->buf + l->pos,l->len - l->pos);
      memcpy(l->buf + l->pos,cbuf,(long)clen);
      l->pos = (long)clen + l->pos;
      l->len = (long)clen + l->len;
      l->buf[l->len] = '\0';
      refreshLine(l);
    }
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, const char *cbuf, int clen) {
    if (l->len+clen <= l->buflen) {
        if (l->len == l->pos) {
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;;
            l->buf[l->len] = '\0';
            if ((!mlmode && promptTextColumnLen(l->prompt,l->plen)+columnPos(l->buf,l->len,l->len) < l->cols && !hintsCallback)) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (maskmode == 1) {
                  static const char d = '*';
                  if (write(l->ofd,&d,1) == -1) return -1;
                } else {
                  if (write(l->ofd,cbuf,clen) == -1) return -1;
                }
            } else {
                refreshLine(l);
            }
        } else {
            memmove(l->buf+l->pos+clen,l->buf+l->pos,l->len-l->pos);
            memcpy(&l->buf[l->pos],cbuf,clen);
            l->pos+=clen;
            l->len+=clen;
            l->buf[l->len] = '\0';
            refreshLine(l);
        }
    }
    return 0;
}